

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int indexCellCompare(BtCursor *pCur,int idx,UnpackedRecord *pIdxKey,RecordCompare xRecordCompare)

{
  long lVar1;
  ushort uVar2;
  byte *pbVar3;
  code *in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  u8 *pCell;
  int nCell;
  int c;
  MemPage *pPage;
  int local_2c;
  
  lVar1 = *(long *)(in_RDI + 0x88);
  pbVar3 = (byte *)(*(long *)(lVar1 + 0x68) +
                   (long)(int)(uint)(*(ushort *)(lVar1 + 0x1a) &
                                    CONCAT11(*(undefined1 *)
                                              (*(long *)(lVar1 + 0x60) + (long)(in_ESI << 1)),
                                             *(undefined1 *)
                                              (*(long *)(lVar1 + 0x60) + 1 + (long)(in_ESI << 1)))))
  ;
  uVar2 = (ushort)*pbVar3;
  if (*(byte *)(lVar1 + 0xb) < uVar2) {
    if (((pbVar3[1] & 0x80) == 0) &&
       (uVar2 = (uVar2 & 0x7f) * 0x80 + (ushort)pbVar3[1], uVar2 <= *(ushort *)(lVar1 + 0xe))) {
      local_2c = (*in_RCX)(uVar2,pbVar3 + 2,in_RDX);
    }
    else {
      local_2c = 99;
    }
  }
  else {
    local_2c = (*in_RCX)(uVar2,pbVar3 + 1,in_RDX);
  }
  return local_2c;
}

Assistant:

static int indexCellCompare(
  BtCursor *pCur,
  int idx,
  UnpackedRecord *pIdxKey,
  RecordCompare xRecordCompare
){
  MemPage *pPage = pCur->pPage;
  int c;
  int nCell;  /* Size of the pCell cell in bytes */
  u8 *pCell = findCellPastPtr(pPage, idx);

  nCell = pCell[0];
  if( nCell<=pPage->max1bytePayload ){
    /* This branch runs if the record-size field of the cell is a
    ** single byte varint and the record fits entirely on the main
    ** b-tree page.  */
    testcase( pCell+nCell+1==pPage->aDataEnd );
    c = xRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
  }else if( !(pCell[1] & 0x80)
    && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
  ){
    /* The record-size field is a 2 byte varint and the record
    ** fits entirely on the main b-tree page.  */
    testcase( pCell+nCell+2==pPage->aDataEnd );
    c = xRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
  }else{
    /* If the record extends into overflow pages, do not attempt
    ** the optimization. */
    c = 99;
  }
  return c;
}